

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

Half deqp::gls::roundTo<deqp::gls::GLValue::Half>(Half *step,Half *value)

{
  Float<unsigned_short,_5,_10,_15,_1U> FVar1;
  Float<unsigned_int,_8,_23,_127,_3U> FVar2;
  undefined8 in_RAX;
  float fVar3;
  deUint32 u32;
  undefined8 local_28;
  
  local_28._2_6_ = (undefined6)((ulong)in_RAX >> 0x10);
  local_28 = CONCAT62(local_28._2_6_,value->m_value);
  FVar2 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                    ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_28);
  local_28 = CONCAT44(FVar2.m_value,local_28._0_4_);
  local_28 = CONCAT62(local_28._2_6_,step->m_value);
  FVar2 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                    ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_28);
  fVar3 = fmodf(local_28._4_4_,(float)FVar2.m_value);
  local_28 = CONCAT44(local_28._4_4_,fVar3);
  FVar1 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)&local_28);
  local_28 = CONCAT62(local_28._2_6_,value->m_value);
  FVar2 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                    ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_28);
  local_28 = CONCAT44(FVar2.m_value,local_28._0_4_);
  local_28 = CONCAT62(local_28._2_6_,FVar1.m_value);
  FVar2 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                    ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_28);
  local_28 = CONCAT44(local_28._4_4_,local_28._4_4_ - (float)FVar2.m_value);
  FVar1 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)&local_28);
  return (Half)FVar1.m_value;
}

Assistant:

T roundTo (const T& step, const T& value)
{
	return value - (value % step);
}